

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  QDBusMenuLayoutItem *item_00;
  char cVar1;
  QDBusArgument *arg_00;
  long in_FS_OFFSET;
  QDBusArgument childArgument;
  undefined1 local_88 [24];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  arg_00 = (QDBusArgument *)QDBusArgument::operator>>(arg,&item->m_id);
  operator>><QMap,_QString,_QVariant,_true>(arg_00,&item->m_properties);
  QDBusArgument::beginArray();
  item_00 = (QDBusMenuLayoutItem *)(local_88 + 8);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QDBusArgument::operator>>(arg,(QDBusVariant *)&local_58);
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::QVariant((QVariant *)item_00,(QVariant *)&local_58);
    qvariant_cast<QDBusArgument>((QVariant *)local_88);
    QVariant::~QVariant((QVariant *)item_00);
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = 0;
    uStack_60 = 0;
    local_88._16_8_ = 0;
    uStack_70 = 0;
    operator>>((QDBusArgument *)local_88,item_00);
    QList<QDBusMenuLayoutItem>::emplaceBack<QDBusMenuLayoutItem_const&>(&item->m_children,item_00);
    QDBusMenuLayoutItem::~QDBusMenuLayoutItem(item_00);
    QDBusArgument::~QDBusArgument((QDBusArgument *)local_88);
    QVariant::~QVariant((QVariant *)&local_58);
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &arg, QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg >> item.m_id >> item.m_properties;
    arg.beginArray();
    while (!arg.atEnd()) {
        QDBusVariant dbusVariant;
        arg >> dbusVariant;
        QDBusArgument childArgument = qvariant_cast<QDBusArgument>(dbusVariant.variant());

        QDBusMenuLayoutItem child;
        childArgument >> child;
        item.m_children.append(child);
    }
    arg.endArray();
    arg.endStructure();
    return arg;
}